

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O1

void setnodevector(lua_State *L,Table *t,int size)

{
  int iVar1;
  Node *pNVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  
  if (size == 0) {
    t->node = &dummynode_;
    iVar7 = 0;
    lVar6 = 0;
  }
  else {
    iVar1 = luaO_log2(size - 1);
    iVar7 = iVar1 + 1;
    if (0x19 < iVar1) {
      luaG_runerror(L,"table overflow");
    }
    uVar5 = 1 << ((byte)iVar7 & 0x1f);
    lVar6 = (long)(int)uVar5;
    if (iVar7 == 0x1f) {
      pNVar2 = (Node *)luaM_toobig(L);
    }
    else {
      pNVar2 = (Node *)luaM_realloc_(L,(void *)0x0,0,lVar6 * 0x28);
    }
    t->node = pNVar2;
    if (iVar7 != 0x1f) {
      uVar3 = 1;
      if (1 < (int)uVar5) {
        uVar3 = (ulong)uVar5;
      }
      lVar4 = 0;
      do {
        pNVar2 = t->node;
        *(undefined8 *)((long)&pNVar2->i_key + lVar4 + 0x10) = 0;
        *(undefined4 *)((long)&pNVar2->i_key + lVar4 + 8) = 0;
        *(undefined4 *)((long)&(pNVar2->i_val).tt + lVar4) = 0;
        lVar4 = lVar4 + 0x28;
      } while (uVar3 * 0x28 != lVar4);
    }
  }
  t->lsizenode = (lu_byte)iVar7;
  t->lastfree = t->node + lVar6;
  return;
}

Assistant:

static void setnodevector (lua_State *L, Table *t, int size) {
  int lsize;
  if (size == 0) {  /* no elements to hash part? */
    t->node = cast(Node *, dummynode);  /* use common `dummynode' */
    lsize = 0;
  }
  else {
    int i;
    lsize = ceillog2(size);
    if (lsize > MAXBITS)
      luaG_runerror(L, "table overflow");
    size = twoto(lsize);
    t->node = luaM_newvector(L, size, Node);
    for (i=0; i<size; i++) {
      Node *n = gnode(t, i);
      gnext(n) = NULL;
      setnilvalue(gkey(n));
      setnilvalue(gval(n));
    }
  }
  t->lsizenode = cast_byte(lsize);
  t->lastfree = gnode(t, size);  /* all positions are free */
}